

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.cpp
# Opt level: O2

void __thiscall xs::MessageWriter::put<int>(MessageWriter *this,int value)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer puVar1;
  pointer puVar2;
  
  this_00 = this->m_buf;
  puVar1 = (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (this_00,(size_type)(puVar1 + (4 - (long)puVar2)));
  *(uint *)(puVar1 + ((long)(this->m_buf->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start - (long)puVar2)) =
       (uint)value >> 0x18 | (value & 0xff0000U) >> 8 | (value & 0xff00U) << 8 | value << 0x18;
  return;
}

Assistant:

void put (T value)
	{
		T netValue = hostToNetwork(value);
		size_t curPos = m_buf.size();
		m_buf.resize(curPos + sizeof(T));
		deMemcpy(&m_buf[curPos], &netValue, sizeof(T));
	}